

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

PatternExpression * PatternExpression::restoreExpression(Element *el,Translate *trans)

{
  int iVar1;
  PatternExpression *pPVar2;
  undefined *puVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)el);
  if (iVar1 == 0) {
    pPVar2 = (PatternExpression *)operator_new(0x30);
    pPVar2->refcount = 0;
    puVar3 = &TokenField::vtable;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)el);
    if (iVar1 == 0) {
      pPVar2 = (PatternExpression *)operator_new(0x28);
      pPVar2->refcount = 0;
      puVar3 = &ContextField::vtable;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)el);
      if (iVar1 == 0) {
        pPVar2 = (PatternExpression *)operator_new(0x18);
        pPVar2->refcount = 0;
        puVar3 = &ConstantValue::vtable;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)el);
        if (iVar1 == 0) {
          pPVar2 = (PatternExpression *)operator_new(0x18);
          pPVar2->refcount = 0;
          puVar3 = &OperandValue::vtable;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)el);
          if (iVar1 == 0) {
            pPVar2 = (PatternExpression *)operator_new(0x10);
            pPVar2->refcount = 0;
            puVar3 = &StartInstructionValue::vtable;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)el);
            if (iVar1 == 0) {
              pPVar2 = (PatternExpression *)operator_new(0x10);
              pPVar2->refcount = 0;
              puVar3 = &EndInstructionValue::vtable;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)el);
              if (iVar1 == 0) {
                pPVar2 = (PatternExpression *)operator_new(0x20);
                pPVar2->refcount = 0;
                pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                *(undefined8 *)&pPVar2[1].refcount = 0;
                puVar3 = &PlusExpression::vtable;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)el);
                if (iVar1 == 0) {
                  pPVar2 = (PatternExpression *)operator_new(0x20);
                  pPVar2->refcount = 0;
                  pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                  *(undefined8 *)&pPVar2[1].refcount = 0;
                  puVar3 = &SubExpression::vtable;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)el);
                  if (iVar1 == 0) {
                    pPVar2 = (PatternExpression *)operator_new(0x20);
                    pPVar2->refcount = 0;
                    pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                    *(undefined8 *)&pPVar2[1].refcount = 0;
                    puVar3 = &MultExpression::vtable;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)el);
                    if (iVar1 == 0) {
                      pPVar2 = (PatternExpression *)operator_new(0x20);
                      pPVar2->refcount = 0;
                      pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                      *(undefined8 *)&pPVar2[1].refcount = 0;
                      puVar3 = &LeftShiftExpression::vtable;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)el);
                      if (iVar1 == 0) {
                        pPVar2 = (PatternExpression *)operator_new(0x20);
                        pPVar2->refcount = 0;
                        pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                        *(undefined8 *)&pPVar2[1].refcount = 0;
                        puVar3 = &RightShiftExpression::vtable;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)el);
                        if (iVar1 == 0) {
                          pPVar2 = (PatternExpression *)operator_new(0x20);
                          pPVar2->refcount = 0;
                          pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                          *(undefined8 *)&pPVar2[1].refcount = 0;
                          puVar3 = &AndExpression::vtable;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)el);
                          if (iVar1 == 0) {
                            pPVar2 = (PatternExpression *)operator_new(0x20);
                            pPVar2->refcount = 0;
                            pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                            *(undefined8 *)&pPVar2[1].refcount = 0;
                            puVar3 = &OrExpression::vtable;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)el);
                            if (iVar1 == 0) {
                              pPVar2 = (PatternExpression *)operator_new(0x20);
                              pPVar2->refcount = 0;
                              pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                              *(undefined8 *)&pPVar2[1].refcount = 0;
                              puVar3 = &XorExpression::vtable;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)el);
                              if (iVar1 == 0) {
                                pPVar2 = (PatternExpression *)operator_new(0x20);
                                pPVar2->refcount = 0;
                                pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                                *(undefined8 *)&pPVar2[1].refcount = 0;
                                puVar3 = &DivExpression::vtable;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)el);
                                if (iVar1 == 0) {
                                  pPVar2 = (PatternExpression *)operator_new(0x18);
                                  pPVar2->refcount = 0;
                                  pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                                  puVar3 = &MinusExpression::vtable;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)el);
                                  if (iVar1 != 0) {
                                    return (PatternExpression *)0x0;
                                  }
                                  pPVar2 = (PatternExpression *)operator_new(0x18);
                                  pPVar2->refcount = 0;
                                  pPVar2[1]._vptr_PatternExpression = (_func_int **)0x0;
                                  puVar3 = &NotExpression::vtable;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pPVar2->_vptr_PatternExpression = (_func_int **)(puVar3 + 0x10);
  (*pPVar2->_vptr_PatternExpression[8])(pPVar2,el,trans);
  return pPVar2;
}

Assistant:

PatternExpression *PatternExpression::restoreExpression(const Element *el,Translate *trans)

{
  PatternExpression *res;
  const string &nm(el->getName());

  if (nm == "tokenfield")
    res = new TokenField();
  else if (nm == "contextfield")
    res = new ContextField();
  else if (nm == "intb")
    res = new ConstantValue();
  else if (nm == "operand_exp")
    res = new OperandValue();
  else if (nm == "start_exp")
    res = new StartInstructionValue();
  else if (nm == "end_exp")
    res = new EndInstructionValue();
  else if (nm == "plus_exp")
    res = new PlusExpression();
  else if (nm == "sub_exp")
    res = new SubExpression();
  else if (nm == "mult_exp")
    res = new MultExpression();
  else if (nm == "lshift_exp")
    res = new LeftShiftExpression();
  else if (nm == "rshift_exp")
    res = new RightShiftExpression();
  else if (nm == "and_exp")
    res = new AndExpression();
  else if (nm == "or_exp")
    res = new OrExpression();
  else if (nm == "xor_exp")
    res = new XorExpression();
  else if (nm == "div_exp")
    res = new DivExpression();
  else if (nm == "minus_exp")
    res = new MinusExpression();
  else if (nm == "not_exp")
    res = new NotExpression();
  else
    return (PatternExpression *)0;

  res->restoreXml(el,trans);
  return res;
}